

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

float __thiscall Assimp::CFIReaderImpl::getAttributeValueAsFloat(CFIReaderImpl *this,char *name)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  undefined8 in_RAX;
  Attribute *pAVar3;
  long lVar4;
  undefined4 extraout_var;
  float fVar5;
  ai_real ret;
  undefined8 local_18;
  
  local_18 = in_RAX;
  pAVar3 = getAttributeByName(this,name);
  if (pAVar3 == (Attribute *)0x0) {
    local_18._4_4_ = 0.0;
  }
  else {
    peVar1 = (pAVar3->value).super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (lVar4 = __dynamic_cast(peVar1,&FIValue::typeinfo,&FIFloatValue::typeinfo,0), lVar4 != 0)) {
      this_00 = (pAVar3->value).
                super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      fVar5 = 0.0;
      if (*(long *)(lVar4 + 0x10) - (long)*(float **)(lVar4 + 8) == 4) {
        fVar5 = **(float **)(lVar4 + 8);
      }
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return fVar5;
      }
      local_18 = CONCAT44(local_18._4_4_,fVar5);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return (float)local_18;
    }
    iVar2 = (**peVar1->_vptr_FIValue)(peVar1);
    local_18 = (ulong)(uint)(float)local_18;
    fast_atoreal_move<float>
              (*(char **)CONCAT44(extraout_var,iVar2),(float *)((long)&local_18 + 4),true);
  }
  return local_18._4_4_;
}

Assistant:

virtual float getAttributeValueAsFloat(const char* name) const /*override*/ {
        const Attribute* attr = getAttributeByName(name);
        if (!attr) {
            return 0;
        }
        std::shared_ptr<const FIFloatValue> floatValue = std::dynamic_pointer_cast<const FIFloatValue>(attr->value);
        if (floatValue) {
            return floatValue->value.size() == 1 ? floatValue->value.front() : 0;
        }

        return fast_atof(attr->value->toString().c_str());
    }